

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
          (compute_order *this,
          solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
          *solver,bit_array *x)

{
  uint uVar1;
  pointer ppVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  _Head_base<0UL,_int_*,_false> _Var6;
  ulong uVar7;
  uint uVar8;
  _Head_base<0UL,_int_*,_false> local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  ppVar2 = (this->m_order).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  uVar1 = solver->m;
  if ((ulong)uVar1 != 0) {
    uVar7 = 0;
    local_38._M_head_impl = (int *)x;
    do {
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_48,(int)solver + 0x10);
      iVar4 = 0;
      if (local_40._M_head_impl != local_48._M_head_impl) {
        iVar4 = 0;
        _Var6._M_head_impl = local_40._M_head_impl;
        do {
          uVar5 = *(uint *)((long)_Var6._M_head_impl + 4);
          uVar8 = uVar5 + 0x3f;
          if (-1 < (int)uVar5) {
            uVar8 = uVar5;
          }
          iVar4 = iVar4 + (uint)(((((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                     *)((long)local_38._M_head_impl + 8))->_M_t).
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                  .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                                  [(int)uVar8 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0);
          _Var6._M_head_impl = _Var6._M_head_impl + 8;
        } while (_Var6._M_head_impl != local_48._M_head_impl);
      }
      piVar3 = (solver->b)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      if (iVar4 < piVar3[uVar7]) {
        uVar5 = piVar3[uVar7] - iVar4;
LAB_002279bb:
        local_48._M_head_impl = (int *)((ulong)uVar5 << 0x20 | uVar7);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_order,
                   (pair<int,_int> *)&local_48);
      }
      else if (piVar3[uVar7] < iVar4) {
        uVar5 = iVar4 - piVar3[uVar7];
        goto LAB_002279bb;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1);
  }
  return (int)((ulong)((long)(this->m_order).
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_order).
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }